

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediumAsteroid.cpp
# Opt level: O3

void __thiscall MediumAsteroid::spawn(MediumAsteroid *this)

{
  Asteroid *this_00;
  _List_node_base *p_Var1;
  list<Entity_*,_std::allocator<Entity_*>_> *in_RSI;
  int iVar2;
  
  iVar2 = 3;
  do {
    randf(0.06,0.12);
    randf(0.04,0.08);
    randf(0.001,0.005);
    rand();
    rand();
    rand();
    this_00 = (Asteroid *)operator_new(0x50);
    SmallAsteroid::SmallAsteroid((SmallAsteroid *)this_00);
    Asteroid::init(this_00,(EVP_PKEY_CTX *)in_RSI);
    p_Var1 = (_List_node_base *)operator_new(0x18);
    p_Var1[1]._M_next = (_List_node_base *)this_00;
    in_RSI = &new_entities_abi_cxx11_;
    std::__detail::_List_node_base::_M_hook(p_Var1);
    new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node.
    _M_size = new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              _M_node._M_size + 1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  Entity::spawn((Entity *)this);
  return;
}

Assistant:

void MediumAsteroid::spawn(void)
{
   // Break into small fragments
   for (int i = 0; i < 3; i++) {
      float dx = randf(0.06f, 0.12f);
      float dy = randf(0.04f, 0.08f);
      float da = randf(0.001, 0.005);
      if (rand() % 2) dx = -dx;
      if (rand() % 2) dy = -dy;
      if (rand() % 2) da = -da;
      SmallAsteroid *sa = new SmallAsteroid();
      sa->init(x, y, dx, dy, da);
      new_entities.push_back(sa);
   }

   Entity::spawn();
}